

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

TestCaseGroup * deqp::gles31::Functional::createSeparateShaderTests(Context *ctx)

{
  TestParams params;
  undefined1 auVar1 [20];
  TestParams params_00;
  TestParams params_01;
  int iVar2;
  deUint32 dVar3;
  deBool dVar4;
  uint uVar5;
  TestCaseGroup *pTVar6;
  TestNode *pTVar7;
  SeparateShaderTest *pSVar8;
  ostream *poVar9;
  size_t sVar10;
  const_iterator cVar11;
  TestNode *pTVar12;
  ulong uVar13;
  long lVar14;
  deUint32 flags;
  char *pcVar15;
  bool *pbVar16;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar17;
  VaryingInterpolation qual;
  VaryingInterpolation qual_00;
  VaryingInterpolation VVar18;
  char *__end;
  bool bVar19;
  bool bVar20;
  string local_468;
  TestCaseGroup *local_448;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen;
  string code;
  pointer local_3e8;
  int iStack_3e0;
  DataType DStack_3dc;
  BindingKind BStack_3d8;
  VaryingInterpolation VStack_3d4;
  VaryingInterpolation VStack_3d0;
  long local_3c0;
  undefined2 local_3b8;
  undefined1 uStack_3b6;
  undefined1 uStack_3b5;
  undefined1 uStack_3b4;
  undefined2 uStack_3b3;
  undefined1 uStack_3b1;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  ostringstream name;
  undefined1 uStack_211;
  undefined1 uStack_1f1;
  ostringstream desc;
  long *local_60 [2];
  long local_50 [2];
  Random rnd;
  
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,ctx->m_testCtx,"separate_shader","Separate shader tests");
  (pTVar6->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02155970;
  pTVar6->m_context = ctx;
  pTVar7 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,ctx->m_testCtx,"pipeline","Pipeline configuration tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar7[1]._vptr_TestNode = (_func_int **)ctx;
  local_448 = pTVar6;
  tcu::TestNode::addChild((TestNode *)pTVar6,pTVar7);
  uVar17 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
    if ((((uVar17 & 4) == 0) || ((uVar17 & 3) == 0)) || ((uVar17 & 3) == 3)) {
      bVar19 = 0xf < uVar17;
      if (bVar19) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"same_",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&desc,"Identically named ",0x12);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"different_",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&desc,"Differently named ",0x12);
      }
      bVar20 = (uVar17 & 8) != 0;
      if (bVar20) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"uniform_",8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"uniforms, ",10);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"constant_",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"constants, ",0xb);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      local_3b8 = 0;
      uStack_3b6 = 0;
      uStack_3b3 = 0;
      uStack_3b0 = 0;
      uStack_3ac = 0;
      uStack_3a8 = 0;
      uStack_3a4 = 5;
      uStack_3a0 = 5;
      auVar1 = ZEXT820(CONCAT17(uStack_3b1,(uint7)CONCAT11(bVar19,bVar20) << 0x18));
      params.varyings.vtxInterp = 5;
      params.initSingle = (bool)auVar1[0];
      params.switchVtx = (bool)auVar1[1];
      params.switchFrg = (bool)auVar1[2];
      params.useUniform = (bool)auVar1[3];
      params.useSameName = (bool)auVar1[4];
      params.useCreateHelper = (bool)auVar1[5];
      params.useProgramUniform = (bool)auVar1[6];
      params._7_1_ = auVar1[7];
      params.varyings.count = auVar1._8_4_;
      params.varyings.type = auVar1._12_4_;
      params.varyings.binding = auVar1._16_4_;
      params.varyings.frgInterp = VARYINGINTERPOLATION_LAST;
      uStack_3b5 = bVar20;
      uStack_3b4 = bVar19;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)pTVar7,(TestCaseGroup *)&seen,&local_468,
                 (string *)(ulong)(uVar17 & 7),(int)in_R8,(ParamFlags)in_R9,params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_468._M_dataplus._M_p._4_4_,local_468._M_dataplus._M_p._0_4_) !=
          &local_468.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_468._M_dataplus._M_p._4_4_,local_468._M_dataplus._M_p._0_4_),
                        local_468.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)seen._M_t._M_impl._0_8_ !=
          &seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)seen._M_t._M_impl._0_8_,
                        (ulong)((long)&(seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
    std::ios_base::~ios_base
              ((ios_base *)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    std::ios_base::~ios_base
              ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 0x20);
  pTVar7 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,ctx->m_testCtx,"program_uniform","ProgramUniform tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar7[1]._vptr_TestNode = (_func_int **)ctx;
  tcu::TestNode::addChild((TestNode *)local_448,pTVar7);
  uVar17 = 0;
  do {
    if (((uVar17 < 4) || ((uVar17 & 3) == 3)) || ((uVar17 & 3) == 0)) {
      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&name,0x1aee929,0x1aee929);
      desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&desc,0x1aee929,0x1aee929);
      auVar1 = ZEXT820(CONCAT17(uStack_1f1,0x1000001000000));
      params_00.varyings.vtxInterp = 5;
      params_00.initSingle = (bool)auVar1[0];
      params_00.switchVtx = (bool)auVar1[1];
      params_00.switchFrg = (bool)auVar1[2];
      params_00.useUniform = (bool)auVar1[3];
      params_00.useSameName = (bool)auVar1[4];
      params_00.useCreateHelper = (bool)auVar1[5];
      params_00.useProgramUniform = (bool)auVar1[6];
      params_00._7_1_ = auVar1[7];
      params_00.varyings.count = auVar1._8_4_;
      params_00.varyings.type = auVar1._12_4_;
      params_00.varyings.binding = auVar1._16_4_;
      params_00.varyings.frgInterp = VARYINGINTERPOLATION_LAST;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)pTVar7,(TestCaseGroup *)&name,(string *)&desc,
                 (string *)(ulong)uVar17,(int)in_R8,(ParamFlags)in_R9,params_00);
      if (desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        desc.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_,
                                 name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_) + 1
                       );
      }
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 8);
  pTVar7 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,ctx->m_testCtx,"create_shader_program",
             "CreateShaderProgram tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar7[1]._vptr_TestNode = (_func_int **)ctx;
  tcu::TestNode::addChild((TestNode *)local_448,pTVar7);
  uVar17 = 0;
  do {
    if (((uVar17 < 4) || ((uVar17 & 3) == 3)) || ((uVar17 & 3) == 0)) {
      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&name,0x1aee929,0x1aee929);
      desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&desc,0x1aee929,0x1aee929);
      auVar1 = ZEXT820(CONCAT17(uStack_211,0x10000000000));
      params_01.varyings.vtxInterp = 5;
      params_01.initSingle = (bool)auVar1[0];
      params_01.switchVtx = (bool)auVar1[1];
      params_01.switchFrg = (bool)auVar1[2];
      params_01.useUniform = (bool)auVar1[3];
      params_01.useSameName = (bool)auVar1[4];
      params_01.useCreateHelper = (bool)auVar1[5];
      params_01.useProgramUniform = (bool)auVar1[6];
      params_01._7_1_ = auVar1[7];
      params_01.varyings.count = auVar1._8_4_;
      params_01.varyings.type = auVar1._12_4_;
      params_01.varyings.binding = auVar1._16_4_;
      params_01.varyings.frgInterp = VARYINGINTERPOLATION_LAST;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)pTVar7,(TestCaseGroup *)&name,(string *)&desc,
                 (string *)(ulong)uVar17,(int)in_R8,(ParamFlags)in_R9,params_01);
      if (desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        desc.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_,
                                 name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_) + 1
                       );
      }
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 8);
  pTVar7 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,ctx->m_testCtx,"interface",
             "Shader interface compatibility tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar7[1]._vptr_TestNode = (_func_int **)ctx;
  tcu::TestNode::addChild((TestNode *)local_448,pTVar7);
  VVar18 = VARYINGINTERPOLATION_SMOOTH;
  do {
    code._M_dataplus._M_p = code._M_dataplus._M_p & 0xff00000000000000;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
    qual = VVar18 & VARYINGINTERPOLATION_DEFAULT;
    qual_00 = VVar18 >> 2 & VARYINGINTERPOLATION_DEFAULT;
    code.field_2._M_allocated_capacity._0_4_ = VVar18 >> 4;
    code._M_string_length = (size_type)&DAT_100000001;
    code.field_2._M_allocated_capacity._4_4_ = qual_00;
    code.field_2._8_4_ = qual;
    if ((VVar18 >> 4 & 1) == 0) {
      lVar14 = 0x19;
      std::__ostream_insert<char,std::char_traits<char>>
                (&name.super_basic_ostream<char,_std::char_traits<char>_>,"same_name",9);
      pcVar15 = "Varyings have same name, ";
    }
    else {
      lVar14 = 0x1d;
      std::__ostream_insert<char,std::char_traits<char>>
                (&name.super_basic_ostream<char,_std::char_traits<char>_>,"same_location",0xd);
      pcVar15 = "Varyings have same location, ";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,pcVar15,lVar14);
    seen._M_t._M_impl._0_8_ = &seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&seen,"vertex","");
    anon_unknown_0::describeInterpolation((string *)&seen,qual_00,&name,&desc);
    if ((_Base_ptr *)seen._M_t._M_impl._0_8_ !=
        &seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)seen._M_t._M_impl._0_8_,
                      (ulong)((long)&(seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    seen._M_t._M_impl._0_8_ = &seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&seen,"fragment","");
    anon_unknown_0::describeInterpolation((string *)&seen,qual,&name,&desc);
    if ((_Base_ptr *)seen._M_t._M_impl._0_8_ !=
        &seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)seen._M_t._M_impl._0_8_,
                      (ulong)((long)&(seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    bVar19 = anon_unknown_0::paramsValid((TestParams *)&code);
    if (bVar19) {
      pSVar8 = (SeparateShaderTest *)operator_new(0x180);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      anon_unknown_0::SeparateShaderTest::SeparateShaderTest
                (pSVar8,ctx,(string *)seen._M_t._M_impl._0_8_,
                 (string *)
                 CONCAT44(local_468._M_dataplus._M_p._4_4_,local_468._M_dataplus._M_p._0_4_),4,
                 (TestParams *)&code,0x14577ca);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_468._M_dataplus._M_p._4_4_,local_468._M_dataplus._M_p._0_4_) !=
          &local_468.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_468._M_dataplus._M_p._4_4_,local_468._M_dataplus._M_p._0_4_),
                        local_468.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)seen._M_t._M_impl._0_8_ !=
          &seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)seen._M_t._M_impl._0_8_,
                        (ulong)((long)&(seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
    std::ios_base::~ios_base
              ((ios_base *)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    std::ios_base::~ios_base
              ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    VVar18 = VVar18 + VARYINGINTERPOLATION_FLAT;
  } while (VVar18 != 0x20);
  iVar2 = tcu::CommandLine::getBaseSeed(ctx->m_testCtx->m_cmdLine);
  dVar3 = deStringHash("separate_shader.random");
  deRandom_init(&rnd.m_rnd,iVar2 + dVar3);
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &seen._M_t._M_impl.super__Rb_tree_header._M_header;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  seen._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pTVar7 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,ctx->m_testCtx,"random","Random pipeline configuration tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar7[1]._vptr_TestNode = (_func_int **)ctx;
  tcu::TestNode::addChild((TestNode *)local_448,pTVar7);
  local_3c0 = 0;
  do {
    iStack_3e0 = 0;
    DStack_3dc = TYPE_LAST;
    BStack_3d8 = BINDING_LAST;
    VStack_3d4 = VARYINGINTERPOLATION_LAST;
    VStack_3d0 = VARYINGINTERPOLATION_LAST;
    code._M_dataplus._M_p = (pointer)&code.field_2;
    code._M_string_length = 0;
    code.field_2._M_allocated_capacity._0_4_ = code.field_2._M_allocated_capacity._0_4_ & 0xffffff00
    ;
    iVar2 = 0x1000;
    do {
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      deRandom_init((deRandom *)&desc,dVar3);
      name.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0;
      name.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0x5e;
      name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_ = 2;
      name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_ = 5;
      name.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ = 5;
      uVar17 = 0;
      do {
        dVar4 = deRandom_getBool((deRandom *)&desc);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             CONCAT71(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                      _1_7_,dVar4 == 1);
        dVar4 = deRandom_getBool((deRandom *)&desc);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_2_ =
             CONCAT11(dVar4 == 1,
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                      _0_1_);
        dVar4 = deRandom_getBool((deRandom *)&desc);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_3_ =
             CONCAT12(dVar4 == 1,
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                      _0_2_);
        dVar4 = deRandom_getBool((deRandom *)&desc);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ =
             CONCAT13(dVar4 == 1,
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                      _0_3_);
        if (dVar4 == 1) {
          dVar4 = deRandom_getBool((deRandom *)&desc);
          bVar19 = dVar4 == 1;
        }
        else {
          bVar19 = false;
        }
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_7_ =
             CONCAT16(bVar19,name.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream._0_6_);
        dVar4 = deRandom_getBool((deRandom *)&desc);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_6_ =
             CONCAT15(dVar4 == 1,
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                      _0_5_);
        dVar4 = deRandom_getBool((deRandom *)&desc);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_5_ =
             CONCAT14(dVar4 == 1,
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                      _0_4_);
        dVar3 = deRandom_getUint32((deRandom *)&desc);
        uVar5 = dVar3 % 5;
        name.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0x5e;
        if (uVar5 == 0) {
          name.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0;
        }
        name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_ = (uVar5 == 0) + 4;
        name.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
             1 << ((char)uVar5 - 1U & 0x1f);
        if (uVar5 == 0) {
          name.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0;
        }
        name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_ = 2;
        name.super_basic_ostream<char,_std::char_traits<char>_>._24_4_ =
             name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_;
        bVar19 = anon_unknown_0::paramsValid((TestParams *)&name);
      } while ((!bVar19) && (bVar19 = uVar17 < 0xf, uVar17 = uVar17 + 1, bVar19));
      local_3e8 = (pointer)name.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream;
      iStack_3e0 = name.super_basic_ostream<char,_std::char_traits<char>_>._8_4_;
      DStack_3dc = name.super_basic_ostream<char,_std::char_traits<char>_>._12_4_;
      BStack_3d8 = name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_;
      VStack_3d4 = name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_;
      VStack_3d0 = name.super_basic_ostream<char,_std::char_traits<char>_>._24_4_;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      pcVar15 = "2";
      if (local_3e8._0_1_ != false) {
        pcVar15 = "1";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,pcVar15,1);
      uVar13 = (ulong)local_3e8 >> 8 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1ab638f;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,pbVar16,uVar13);
      uVar13 = (ulong)local_3e8 >> 0x10 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1accd49;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,pbVar16,uVar13);
      uVar13 = (ulong)local_3e8 >> 0x30 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1b9f12a;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,pbVar16,uVar13);
      uVar13 = (ulong)local_3e8 >> 0x18 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1ad5cd4;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,pbVar16,uVar13);
      uVar13 = (ulong)local_3e8 >> 0x20 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1c21c7b;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,pbVar16,uVar13);
      uVar13 = (ulong)local_3e8 >> 0x28 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1accd37;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,pbVar16,uVar13);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      std::ostream::operator<<((TestParams *)&name,iStack_3e0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      std::ios_base::~ios_base
                ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&desc,
                          (char *)CONCAT44(local_468._M_dataplus._M_p._4_4_,
                                           local_468._M_dataplus._M_p._0_4_),
                          local_468._M_string_length);
      pbVar16 = (bool *)0x1c3142a;
      if (BStack_3d8 != BINDING_NAME) {
        if (BStack_3d8 == BINDING_LOCATION) {
          pbVar16 = (bool *)0x1aa946b;
        }
        else {
          pbVar16 = glcts::fixed_sample_locations_values + 1;
          if (BStack_3d8 == BINDING_LAST) {
            pbVar16 = (bool *)0x1a1d09e;
          }
        }
      }
      sVar10 = strlen(pbVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pbVar16,sVar10);
      if ((ulong)VStack_3d4 < 3) {
        pcVar15 = *(char **)(&DAT_021579f8 + (ulong)VStack_3d4 * 8);
      }
      else {
        pcVar15 = "o";
        if (VStack_3d4 == VARYINGINTERPOLATION_RANDOM) {
          pcVar15 = "r";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,1);
      if ((ulong)VStack_3d0 < 3) {
        pcVar15 = *(char **)(&DAT_021579f8 + (ulong)VStack_3d0 * 8);
      }
      else {
        pcVar15 = "o";
        if (VStack_3d0 == VARYINGINTERPOLATION_RANDOM) {
          pcVar15 = "r";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_468._M_dataplus._M_p._4_4_,local_468._M_dataplus._M_p._0_4_) !=
          &local_468.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_468._M_dataplus._M_p._4_4_,local_468._M_dataplus._M_p._0_4_),
                        local_468.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base
                ((ios_base *)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      std::__cxx11::string::operator=((string *)&code,(string *)local_60);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&seen._M_t,&code);
    } while (((_Rb_tree_header *)cVar11._M_node != &seen._M_t._M_impl.super__Rb_tree_header) &&
            (iVar2 = iVar2 + -1, iVar2 != 0));
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&seen,&code);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    std::ostream::_M_insert<unsigned_long>((ulong)&name);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    std::ios_base::~ios_base
              ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    pSVar8 = (SeparateShaderTest *)operator_new(0x180);
    anon_unknown_0::SeparateShaderTest::SeparateShaderTest
              (pSVar8,ctx,
               (string *)desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               ,(string *)
                desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,4,
               (TestParams *)&local_3e8,0x14577ca);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar8);
    if (desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                      desc.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)code._M_dataplus._M_p != &code.field_2) {
      operator_delete(code._M_dataplus._M_p,
                      CONCAT44(code.field_2._M_allocated_capacity._4_4_,
                               code.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_3c0 = local_3c0 + 1;
  } while (local_3c0 != 0x80);
  pTVar7 = (TestNode *)operator_new(0x78);
  pTVar6 = local_448;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,ctx->m_testCtx,"api","Program pipeline API tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar7[1]._vptr_TestNode = (_func_int **)ctx;
  tcu::TestNode::addChild((TestNode *)pTVar6,pTVar7);
  local_468._M_dataplus._M_p._4_4_ = (uint)local_468._M_dataplus._M_p._7_1_ << 0x18;
  local_468._M_string_length = 0;
  local_468.field_2._M_allocated_capacity = 0x500000000;
  local_468.field_2._8_4_ = 5;
  local_468._M_dataplus._M_p._0_4_ = 0x1000000;
  pSVar8 = (SeparateShaderTest *)operator_new(0x180);
  name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"current_program_priority","");
  desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&desc,"Test priority between current program and pipeline binding","");
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar8,ctx,
             (string *)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
             (string *)desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,1
             ,(TestParams *)&local_468,0x145833c);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar8);
  if (desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    desc.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_,
                             name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_) + 1);
  }
  pSVar8 = (SeparateShaderTest *)operator_new(0x180);
  name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"active_program_uniform","");
  desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&desc,"Test that glUniform() affects a pipeline\'s active program","");
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar8,ctx,
             (string *)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
             (string *)desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,1
             ,(TestParams *)&local_468,0x14587b0);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar8);
  if (desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    desc.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_,
                             name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_) + 1);
  }
  pSVar8 = (SeparateShaderTest *)operator_new(0x180);
  name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"pipeline_programs","");
  desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&desc,"Test queries for programs in program pipeline stages","");
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar8,ctx,
             (string *)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
             (string *)desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,1
             ,(TestParams *)&local_468,0x1458d0a);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar8);
  if (desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    desc.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_,
                             name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_) + 1);
  }
  pSVar8 = (SeparateShaderTest *)operator_new(0x180);
  name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"pipeline_active","");
  desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&desc,"Test query for active programs in a program pipeline","");
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar8,ctx,
             (string *)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
             (string *)desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,1
             ,(TestParams *)&local_468,0x1458f4c);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar8);
  if (desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&desc.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    desc.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  pTVar6 = local_448;
  if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>._20_4_,
                             name.super_basic_ostream<char,_std::char_traits<char>_>._16_4_) + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,ctx->m_testCtx,"validation",
             "Negative program pipeline interface matching");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar7[1]._vptr_TestNode = (_func_int **)ctx;
  tcu::TestNode::addChild((TestNode *)pTVar6,pTVar7);
  pTVar12 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,ctx->m_testCtx,"es31",
             "GLSL ES 3.1 pipeline interface matching");
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar12[1]._vptr_TestNode = (_func_int **)ctx;
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)&name,ctx->m_testCtx,ctx->m_renderCtx,ctx->m_contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&desc,
             (ShaderLibrary *)&name,"shaders/es31/separate_shader_validation.test");
  if (0 < (int)((ulong)(desc.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ -
                       (long)desc.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream) >> 3)) {
    lVar14 = 0;
    do {
      tcu::TestNode::addChild
                (pTVar12,(TestNode *)
                         desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                         [lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)((ulong)(desc.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ -
                                   (long)desc.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream) >> 3));
  }
  tcu::TestNode::addChild(pTVar7,pTVar12);
  if (desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)0x0) {
    operator_delete(desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    desc.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ -
                    (long)desc.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream);
  }
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&name);
  pTVar12 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,ctx->m_testCtx,"es32",
             "GLSL ES 3.2 pipeline interface matching");
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar12[1]._vptr_TestNode = (_func_int **)ctx;
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)&name,ctx->m_testCtx,ctx->m_renderCtx,ctx->m_contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&desc,
             (ShaderLibrary *)&name,"shaders/es32/separate_shader_validation.test");
  if (0 < (int)((ulong)(desc.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ -
                       (long)desc.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream) >> 3)) {
    lVar14 = 0;
    do {
      tcu::TestNode::addChild
                (pTVar12,(TestNode *)
                         desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                         [lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)((ulong)(desc.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ -
                                   (long)desc.super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream) >> 3));
  }
  tcu::TestNode::addChild(pTVar7,pTVar12);
  if (desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)0x0) {
    operator_delete(desc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    desc.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ -
                    (long)desc.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream);
  }
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&seen._M_t);
  return pTVar6;
}

Assistant:

TestCaseGroup* createSeparateShaderTests (Context& ctx)
{
	TestParams		defaultParams;
	int				numIterations	= 4;
	TestCaseGroup*	group			=
		new TestCaseGroup(ctx, "separate_shader", "Separate shader tests");

	defaultParams.useUniform			= false;
	defaultParams.initSingle			= false;
	defaultParams.switchVtx				= false;
	defaultParams.switchFrg				= false;
	defaultParams.useCreateHelper		= false;
	defaultParams.useProgramUniform		= false;
	defaultParams.useSameName			= false;
	defaultParams.varyings.count		= 0;
	defaultParams.varyings.type			= glu::TYPE_INVALID;
	defaultParams.varyings.binding		= BINDING_NAME;
	defaultParams.varyings.vtxInterp	= VARYINGINTERPOLATION_LAST;
	defaultParams.varyings.frgInterp	= VARYINGINTERPOLATION_LAST;

	TestCaseGroup* stagesGroup =
		new TestCaseGroup(ctx, "pipeline", "Pipeline configuration tests");
	group->addChild(stagesGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST << 2; ++flags)
	{
		TestParams		params			= defaultParams;
		ostringstream	name;
		ostringstream	desc;

		if (!areCaseParamFlagsValid(ParamFlags(flags & PARAMFLAGS_MASK)))
			continue;

		if (flags & (PARAMFLAGS_LAST << 1))
		{
			params.useSameName = true;
			name << "same_";
			desc << "Identically named ";
		}
		else
		{
			name << "different_";
			desc << "Differently named ";
		}

		if (flags & PARAMFLAGS_LAST)
		{
			params.useUniform = true;
			name << "uniform_";
			desc << "uniforms, ";
		}
		else
		{
			name << "constant_";
			desc << "constants, ";
		}

		addRenderTest(*stagesGroup, name.str(), desc.str(), numIterations,
					  ParamFlags(flags & PARAMFLAGS_MASK), params);
	}

	TestCaseGroup* programUniformGroup =
		new TestCaseGroup(ctx, "program_uniform", "ProgramUniform tests");
	group->addChild(programUniformGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST; ++flags)
	{
		TestParams		params			= defaultParams;

		if (!areCaseParamFlagsValid(ParamFlags(flags)))
			continue;

		params.useUniform = true;
		params.useProgramUniform = true;

		addRenderTest(*programUniformGroup, "", "", numIterations, ParamFlags(flags), params);
	}

	TestCaseGroup* createShaderProgramGroup =
		new TestCaseGroup(ctx, "create_shader_program", "CreateShaderProgram tests");
	group->addChild(createShaderProgramGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST; ++flags)
	{
		TestParams		params			= defaultParams;

		if (!areCaseParamFlagsValid(ParamFlags(flags)))
			continue;

		params.useCreateHelper = true;

		addRenderTest(*createShaderProgramGroup, "", "", numIterations,
					  ParamFlags(flags), params);
	}

	TestCaseGroup* interfaceGroup =
		new TestCaseGroup(ctx, "interface", "Shader interface compatibility tests");
	group->addChild(interfaceGroup);

	enum
	{
		NUM_INTERPOLATIONS	= VARYINGINTERPOLATION_RANDOM, // VARYINGINTERPOLATION_RANDOM is one after last fully specified interpolation
		INTERFACEFLAGS_LAST = BINDING_LAST * NUM_INTERPOLATIONS * NUM_INTERPOLATIONS
	};

	for (deUint32 flags = 0; flags < INTERFACEFLAGS_LAST; ++flags)
	{
		deUint32				tmpFlags	= flags;
		VaryingInterpolation	frgInterp	= VaryingInterpolation(tmpFlags % NUM_INTERPOLATIONS);
		VaryingInterpolation	vtxInterp	= VaryingInterpolation((tmpFlags /= NUM_INTERPOLATIONS)
																   % NUM_INTERPOLATIONS);
		BindingKind				binding		= BindingKind((tmpFlags /= NUM_INTERPOLATIONS)
														  % BINDING_LAST);
		TestParams				params		= defaultParams;
		ostringstream			name;
		ostringstream			desc;

		params.varyings.count		= 1;
		params.varyings.type		= glu::TYPE_FLOAT;
		params.varyings.binding		= binding;
		params.varyings.vtxInterp	= vtxInterp;
		params.varyings.frgInterp	= frgInterp;

		switch (binding)
		{
			case BINDING_LOCATION:
				name << "same_location";
				desc << "Varyings have same location, ";
				break;
			case BINDING_NAME:
				name << "same_name";
				desc << "Varyings have same name, ";
				break;
			default:
				DE_FATAL("Impossible");
		}

		describeInterpolation("vertex", vtxInterp, name, desc);
		describeInterpolation("fragment", frgInterp, name, desc);

		if (!paramsValid(params))
			continue;

		interfaceGroup->addChild(
			new SeparateShaderTest(ctx, name.str(), desc.str(), numIterations, params,
								   &SeparateShaderTest::testPipelineRendering));
	}

	deUint32		baseSeed	= ctx.getTestContext().getCommandLine().getBaseSeed();
	Random			rnd			(deStringHash("separate_shader.random") + baseSeed);
	set<string>		seen;
	TestCaseGroup*	randomGroup	= new TestCaseGroup(
		ctx, "random", "Random pipeline configuration tests");
	group->addChild(randomGroup);

	for (deUint32 i = 0; i < 128; ++i)
	{
		TestParams		params;
		string			code;
		deUint32		genIterations	= 4096;

		do
		{
			params	= genParams(rnd.getUint32());
			code	= paramsCode(params);
		} while (de::contains(seen, code) && --genIterations > 0);

		seen.insert(code);

		string name = de::toString(i); // Would be code but baseSeed can change

		randomGroup->addChild(new SeparateShaderTest(
								  ctx, name, name, numIterations, params,
								  &SeparateShaderTest::testPipelineRendering));
	}

	TestCaseGroup* apiGroup =
		new TestCaseGroup(ctx, "api", "Program pipeline API tests");
	group->addChild(apiGroup);

	{
		// More or less random parameters. These shouldn't have much effect, so just
		// do a single sample.
		TestParams params = defaultParams;
		params.useUniform = true;
		apiGroup->addChild(new SeparateShaderTest(
								  ctx,
								  "current_program_priority",
								  "Test priority between current program and pipeline binding",
								  1, params, &SeparateShaderTest::testCurrentProgPriority));
		apiGroup->addChild(new SeparateShaderTest(
								  ctx,
								  "active_program_uniform",
								  "Test that glUniform() affects a pipeline's active program",
								  1, params, &SeparateShaderTest::testActiveProgramUniform));

		apiGroup->addChild(new SeparateShaderTest(
								 ctx,
								 "pipeline_programs",
								 "Test queries for programs in program pipeline stages",
								 1, params, &SeparateShaderTest::testPipelineQueryPrograms));

		apiGroup->addChild(new SeparateShaderTest(
								 ctx,
								 "pipeline_active",
								 "Test query for active programs in a program pipeline",
								 1, params, &SeparateShaderTest::testPipelineQueryActive));
	}

	TestCaseGroup* interfaceMismatchGroup =
		new TestCaseGroup(ctx, "validation", "Negative program pipeline interface matching");
	group->addChild(interfaceMismatchGroup);

	{
		TestCaseGroup*						es31Group		= new TestCaseGroup(ctx, "es31", "GLSL ES 3.1 pipeline interface matching");
		gls::ShaderLibrary					shaderLibrary	(ctx.getTestContext(), ctx.getRenderContext(), ctx.getContextInfo());
		const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es31/separate_shader_validation.test");

		for (int i = 0; i < (int)children.size(); i++)
			es31Group->addChild(children[i]);

		interfaceMismatchGroup->addChild(es31Group);
	}

	{
		TestCaseGroup*						es32Group		= new TestCaseGroup(ctx, "es32", "GLSL ES 3.2 pipeline interface matching");
		gls::ShaderLibrary					shaderLibrary	(ctx.getTestContext(), ctx.getRenderContext(), ctx.getContextInfo());
		const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es32/separate_shader_validation.test");

		for (int i = 0; i < (int)children.size(); i++)
			es32Group->addChild(children[i]);

		interfaceMismatchGroup->addChild(es32Group);
	}

	return group;
}